

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_EnumReservedNameRedundant_Test::
~ValidationErrorTest_EnumReservedNameRedundant_Test
          (ValidationErrorTest_EnumReservedNameRedundant_Test *this)

{
  ValidationErrorTest_EnumReservedNameRedundant_Test *this_local;
  
  ~ValidationErrorTest_EnumReservedNameRedundant_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, EnumReservedNameRedundant) {
  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "enum_type {"
      "  name: \"Foo\""
      "  value { name:\"FOO\" number:15 }"
      "  reserved_name: \"foo\""
      "  reserved_name: \"foo\""
      "}",

      "foo.proto: foo: NAME: Enum value \"foo\" is reserved multiple times.\n");
}